

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdhopt.c
# Opt level: O2

int mbedtls_ecdhopt_responder
              (mbedtls_ecdhopt_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  uchar base [32];
  
  if (ctx == (mbedtls_ecdhopt_context *)0x0) {
    iVar2 = -0x4f80;
  }
  else {
    if (ctx->curve != MBEDTLS_ECP_DP_CURVE25519) {
      (ctx->ctx).ec.point_format = ctx->point_format;
      iVar2 = mbedtls_ecdh_make_public(&(ctx->ctx).ec,olen,buf,blen,f_rng,p_rng);
      return iVar2;
    }
    base[0x10] = '\0';
    base[0x11] = '\0';
    base[0x12] = '\0';
    base[0x13] = '\0';
    base[0x14] = '\0';
    base[0x15] = '\0';
    base[0x16] = '\0';
    base[0x17] = '\0';
    base[0x18] = '\0';
    base[0x19] = '\0';
    base[0x1a] = '\0';
    base[0x1b] = '\0';
    base[0x1c] = '\0';
    base[0x1d] = '\0';
    base[0x1e] = '\0';
    base[0x1f] = '\0';
    base[8] = '\0';
    base[9] = '\0';
    base[10] = '\0';
    base[0xb] = '\0';
    base[0xc] = '\0';
    base[0xd] = '\0';
    base[0xe] = '\0';
    base[0xf] = '\0';
    *olen = 0x21;
    iVar2 = -0x4f00;
    if (0x20 < blen) {
      *buf = ' ';
      base[0] = '\t';
      base[1] = '\0';
      base[2] = '\0';
      base[3] = '\0';
      base[4] = '\0';
      base[5] = '\0';
      base[6] = '\0';
      base[7] = '\0';
      Hacl_Curve25519_crypto_scalarmult(buf + 1,(uint8_t *)&ctx->ctx,base);
      base._0_8_ = (ulong)(uint7)base._1_7_ << 8;
      iVar1 = bcmp(buf + 1,base,0x20);
      iVar2 = -0x4d00;
      if (iVar1 != 0) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ecdhopt_responder( mbedtls_ecdhopt_context *ctx, size_t *olen,
                      unsigned char *buf, size_t blen,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    if( ctx == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ctx->curve == MBEDTLS_ECP_DP_CURVE25519 )
    {
        unsigned char base[32] = {0};
        *olen = 33;
        if( blen < *olen )
            return( MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL );
        *buf++ = 32;

        base[0] = 9; // generator of x25519
        Hacl_Curve25519_crypto_scalarmult( buf, ctx->ctx.x25519.our_secret, base );

        base[0] = 0;
        if( memcmp( buf, base, 32) == 0 )
            return MBEDTLS_ERR_ECP_RANDOM_FAILED;

        return( 0 );
    }
    else
    {
        ctx->ctx.ec.point_format = ctx->point_format;
        return mbedtls_ecdh_make_public( &ctx->ctx.ec, olen, buf, blen, f_rng, p_rng );
    }
}